

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_Explode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  MetaClass *pMVar1;
  AActor *pAVar2;
  bool bVar3;
  bool bVar4;
  bool local_bf;
  bool local_ba;
  bool local_b7;
  FName local_b0;
  int u;
  uint local_a8;
  int count;
  int pflags;
  TAngle<double> local_98;
  int local_8c;
  int i;
  DAngle ang;
  PClassActor *pPStack_78;
  FName damagetype;
  MetaClass *pufftype;
  int local_68;
  int naildamage;
  int nails;
  int fulldmgdistance;
  int iStack_58;
  bool alert;
  int flags;
  int distance;
  int damage;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_b7 = true;
  if (this != (AActor *)0x0) {
    local_b7 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_b7 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
      bVar3 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_ba = true;
    if (this_00 != (DObject *)0x0) {
      local_ba = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_ba == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, param[2].field_0.field_1.atag != 8)) {
      bVar3 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x568,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    flags = -1;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x569,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    flags = param[3].field_0.i;
  }
  if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
    iStack_58 = -1;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56a,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    iStack_58 = param[4].field_0.i;
  }
  if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
    fulldmgdistance = 1;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    fulldmgdistance = param[5].field_0.i;
  }
  if ((numparam < 7) || (param[6].field_0.field_3.Type == 0xff)) {
    bVar3 = false;
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56c,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar3 = param[6].field_0.i != 0;
  }
  if ((numparam < 8) || (param[7].field_0.field_3.Type == 0xff)) {
    naildamage = 0;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56d,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    naildamage = param[7].field_0.i;
  }
  if ((numparam < 9) || (param[8].field_0.field_3.Type == 0xff)) {
    local_68 = 0;
  }
  else {
    if (param[8].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56e,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_68 = param[8].field_0.i;
  }
  if ((numparam < 10) || (param[9].field_0.field_3.Type == 0xff)) {
    pufftype._4_4_ = 10;
  }
  else {
    if (param[9].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x56f,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pufftype._4_4_ = param[9].field_0.i;
  }
  if ((numparam < 0xb) || (param[10].field_0.field_3.Type == 0xff)) {
    pPStack_78 = PClass::FindActor(NAME_BulletPuff);
  }
  else {
    bVar4 = false;
    if ((param[10].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[10].field_0.field_1.atag != 1)) {
      bVar4 = param[10].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x570,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pPStack_78 = (PClassActor *)param[10].field_0.field_1.a;
    local_bf = true;
    if (pPStack_78 != (PClassActor *)0x0) {
      local_bf = PClass::IsDescendantOf((PClass *)pPStack_78,AActor::RegistrationInfo.MyClass);
    }
    if (local_bf == false) {
      __assert_fail("pufftype == NULL || pufftype->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x570,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  FName::FName((FName *)((long)&ang.Degrees + 4));
  if ((numparam < 0xc) || (param[0xb].field_0.field_3.Type == 0xff)) {
    FName::operator=((FName *)((long)&ang.Degrees + 4),NAME_None);
  }
  else {
    if (param[0xb].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x571,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    FName::operator=((FName *)((long)&ang.Degrees + 4),param[0xb].field_0.i);
  }
  if (flags < 0) {
    pMVar1 = AActor::GetClass(this);
    flags = pMVar1->ExplosionDamage;
    pMVar1 = AActor::GetClass(this);
    iStack_58 = pMVar1->ExplosionRadius;
    pMVar1 = AActor::GetClass(this);
    fulldmgdistance = (int)((pMVar1->DontHurtShooter ^ 0xffU) & 1);
    bVar3 = false;
  }
  if (iStack_58 < 1) {
    iStack_58 = flags;
  }
  if (local_68 != 0) {
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff78);
    for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
      TAngle<double>::operator=
                ((TAngle<double> *)&stack0xffffffffffffff78,
                 ((double)local_8c * 360.0) / (double)local_68);
      TAngle<double>::TAngle(&local_98,(TAngle<double> *)&stack0xffffffffffffff78);
      TAngle<double>::TAngle((TAngle<double> *)&pflags,0.0);
      FName::FName((FName *)&count,NAME_Hitscan);
      P_LineAttack(this,&local_98,2048.0,(DAngle *)&pflags,pufftype._4_4_,(FName *)&count,pPStack_78
                   ,0,(FTranslatedLineTarget *)0x0,(int *)0x0);
    }
  }
  if (((fulldmgdistance & 8U) == 0) &&
     (bVar4 = FName::operator==((FName *)((long)&ang.Degrees + 4),NAME_None), bVar4)) {
    FName::operator=((FName *)((long)&ang.Degrees + 4),&(this->DamageType).super_FName);
  }
  local_a8 = (uint)((fulldmgdistance & 1U) != 0);
  if ((fulldmgdistance & 4U) != 0) {
    local_a8 = local_a8 | 4;
  }
  pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  FName::FName(&local_b0,(FName *)((long)&ang.Degrees + 4));
  u = P_RadiusAttack(this,pAVar2,flags,iStack_58,&local_b0,local_a8,naildamage);
  P_CheckSplash(this,(double)iStack_58);
  if (((bVar3) && (bVar3 = TObjPtr<AActor>::operator!=(&this->target,(AActor *)0x0), bVar3)) &&
     (pAVar2 = TObjPtr<AActor>::operator->(&this->target), pAVar2->player != (player_t *)0x0)) {
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
    P_NoiseAlert(pAVar2,this,false,0.0);
  }
  if (numret < 1) {
    stack_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x59b,"int AF_A_Explode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,u);
    stack_local._4_4_ = 1;
  }
  return stack_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Explode)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT	(damage)		   { damage = -1; }
	PARAM_INT_OPT	(distance)		   { distance = -1; }
	PARAM_INT_OPT	(flags)			   { flags = XF_HURTSOURCE; }
	PARAM_BOOL_OPT	(alert)			   { alert = false; }
	PARAM_INT_OPT	(fulldmgdistance)  { fulldmgdistance = 0; }
	PARAM_INT_OPT	(nails)			   { nails = 0; }
	PARAM_INT_OPT	(naildamage)	   { naildamage = 10; }
	PARAM_CLASS_OPT	(pufftype, AActor) { pufftype = PClass::FindActor(NAME_BulletPuff); }
	PARAM_NAME_OPT	(damagetype)		{ damagetype = NAME_None; }

	if (damage < 0)	// get parameters from metadata
	{
		damage = self->GetClass()->ExplosionDamage;
		distance = self->GetClass()->ExplosionRadius;
		flags = !self->GetClass()->DontHurtShooter;
		alert = false;
	}
	if (distance <= 0) distance = damage;

	// NailBomb effect, from SMMU but not from its source code: instead it was implemented and
	// generalized from the documentation at http://www.doomworld.com/eternity/engine/codeptrs.html

	if (nails)
	{
		DAngle ang;
		for (int i = 0; i < nails; i++)
		{
			ang = i*360./nails;
			// Comparing the results of a test wad with Eternity, it seems A_NailBomb does not aim
			P_LineAttack (self, ang, MISSILERANGE, 0.,
				//P_AimLineAttack (self, ang, MISSILERANGE), 
				naildamage, NAME_Hitscan, pufftype);
		}
	}

	if (!(flags & XF_NOACTORTYPE) && damagetype == NAME_None)
	{
		damagetype = self->DamageType;
	}

	int pflags = 0;
	if (flags & XF_HURTSOURCE)	pflags |= RADF_HURTSOURCE;
	if (flags & XF_NOTMISSILE)	pflags |= RADF_SOURCEISSPOT;

	int count = P_RadiusAttack (self, self->target, damage, distance, damagetype, pflags, fulldmgdistance);
	P_CheckSplash(self, distance);
	if (alert && self->target != NULL && self->target->player != NULL)
	{
		P_NoiseAlert(self->target, self);
	}
	ACTION_RETURN_INT(count);
}